

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string_view<char,_std::char_traits<char>_> *args,char (*args_1) [4],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char (*local_38) [4];
  size_type local_30;
  pointer local_28;
  
  local_70._M_len = (a->View_)._M_len;
  local_70._M_str = (a->View_)._M_str;
  local_60 = (b->View_)._M_len;
  pcStack_58 = (b->View_)._M_str;
  local_50 = args->_M_len;
  pcStack_48 = args->_M_str;
  local_40 = strlen(*args_1);
  local_28 = (args_2->_M_dataplus)._M_p;
  local_30 = args_2->_M_string_length;
  views._M_len = 5;
  views._M_array = &local_70;
  local_38 = args_1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}